

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.cpp
# Opt level: O0

bool vera::loadSTL(string *_filename,Mesh *_mesh)

{
  vec3 *_p0;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream_00;
  undefined8 uVar4;
  size_t sVar5;
  ostream *poVar6;
  long lVar7;
  bool local_3e0d;
  bool local_3ddb;
  bool local_3dcd;
  bool local_3d9d;
  bool local_3d3a;
  undefined1 local_3d16 [2];
  undefined1 local_3d14 [6];
  unsigned_short att_count;
  vec3 v_1;
  size_t c;
  vec3 n_1;
  Triangle tri_1;
  undefined1 local_3c38 [4];
  int t;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> triangles;
  undefined1 local_3c18 [4];
  uint num_tri;
  char header_1 [80];
  allocator local_3bb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3bb8;
  char local_3b98 [8];
  char endfacet [2048];
  double dStack_3388;
  int ret_2;
  double vd [3];
  vec3 v;
  allocator local_3331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3330;
  int local_330c;
  char local_3308 [4];
  int ret_1;
  char word [2048];
  size_t local_2b00;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2af0;
  byte local_2acb;
  byte local_2aca;
  allocator local_2ac9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ac8;
  char local_2aa8 [8];
  char loop [2048];
  char outer [2048];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1aa0;
  byte local_1a7b;
  byte local_1a7a;
  allocator local_1a79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a78;
  byte local_1a53;
  byte local_1a52;
  allocator local_1a51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50;
  int local_1a30;
  allocator local_1a29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a28;
  double local_1a08;
  double nd [3];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_19e4;
  float local_19e0;
  vec3 n;
  Triangle tri;
  char normal [2048];
  char facet [2048];
  char local_918 [4];
  int ret;
  char name [2048];
  int file_size;
  size_t num_faces;
  char buf [4];
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  bool local_c9;
  char local_c8 [7];
  bool is_ascii;
  char solid [80];
  char header [80];
  FILE *stl_file;
  Mesh *_mesh_local;
  string *_filename_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(pcVar3,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"IOError: %s could not be opened...\n",uVar4);
    return false;
  }
  memset(local_c8,0,0x50);
  local_c9 = true;
  sVar5 = fread(solid + 0x48,1,0x50,__stream_00);
  if (sVar5 != 0x50) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: too short (1).");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    goto LAB_00590af9;
  }
  __isoc99_sscanf(solid + 0x48,"%79s",local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"solid",&local_f1);
  bVar1 = std::operator!=(&local_f0,local_c8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (bVar1) {
    local_c9 = false;
  }
  else {
    sVar5 = fread(&num_faces,1,4,__stream_00);
    if (sVar5 != 4) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: too short (3).");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_00590af9;
    }
    fseek(__stream_00,0,2);
    lVar7 = ftell(__stream_00);
    name._2044_4_ = (undefined4)lVar7;
    local_c9 = (long)(int)name._2044_4_ != (ulong)(uint)num_faces * 0x32 + 0x54;
  }
  if (local_c9 == false) {
    fseek(__stream_00,0,0);
    sVar5 = fread(local_3c18,1,0x50,__stream_00);
    if (sVar5 != 0x50) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (6).");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_00590af9;
    }
    sVar5 = fread((void *)((long)&triangles.
                                  super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),4,1,
                  __stream_00);
    if (sVar5 != 1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (7).");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_00590af9;
    }
    std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::vector
              ((vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)local_3c38);
    std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::resize
              ((vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)local_3c38,
               (ulong)triangles.super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    for (tri_1.m_tangents.
         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        tri_1.m_tangents.
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
        (int)triangles.super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
        tri_1.m_tangents.
        super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             tri_1.m_tangents.
             super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      Triangle::Triangle((Triangle *)&n_1.field_1);
      sVar5 = fread((void *)((long)&c + 4),4,3,__stream_00);
      if (sVar5 == 3) {
        _p0 = (vec3 *)((long)&c + 4);
        Triangle::setNormals((Triangle *)&n_1.field_1,_p0,_p0,_p0);
        v_1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
        v_1.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
        for (; (ulong)v_1._4_8_ < 3; v_1._4_8_ = v_1._4_8_ + 1) {
          sVar5 = fread(local_3d14,4,3,__stream_00);
          if (sVar5 != 3) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (9).");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_1a30 = 2;
            goto LAB_00590a98;
          }
          Triangle::setVertex((Triangle *)&n_1.field_1,v_1._4_8_,(vec3 *)local_3d14);
        }
        sVar5 = fread(local_3d16,2,1,__stream_00);
        if (sVar5 == 1) {
          local_1a30 = 0;
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (10).");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_1a30 = 2;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (8).");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        local_1a30 = 2;
      }
LAB_00590a98:
      Triangle::~Triangle((Triangle *)&n_1.field_1);
      if (local_1a30 != 0) goto LAB_00590ad0;
    }
    local_1a30 = 7;
LAB_00590ad0:
    std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector
              ((vector<vera::Triangle,_std::allocator<vera::Triangle>_> *)local_3c38);
  }
  else {
    fseek(__stream_00,0,0);
    if (__stream_00 == (FILE *)0x0) {
      fprintf(_stderr,"IOError: stl file could not be reopened as ascii ...\n");
      return false;
    }
    pcVar3 = fgets(local_918,0x800,__stream_00);
    if (pcVar3 == (char *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: ascii too short (2).");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_00590af9;
    }
    do {
      Triangle::Triangle((Triangle *)&n.field_1);
      iVar2 = __isoc99_fscanf(__stream_00,"%s %s %lg %lg %lg",normal + 0x7f8,
                              &tri.m_tangents.
                               super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a08,nd,
                              nd + 1);
      local_19e4.x = (float)local_1a08;
      local_19e0 = (float)nd[0];
      n.field_0.x = (float)nd[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1a28,"endsolid",&local_1a29);
      bVar1 = std::operator==(&local_1a28,normal + 0x7f8);
      std::__cxx11::string::~string((string *)&local_1a28);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a29);
      if (bVar1) {
        local_1a30 = 4;
      }
      else {
        local_1a52 = 0;
        local_1a53 = 0;
        local_1a7a = 0;
        local_1a7b = 0;
        outer[0x7fe] = '\0';
        outer[0x7fd] = '\0';
        local_3d3a = true;
        if (iVar2 == 5) {
          std::allocator<char>::allocator();
          local_1a52 = 1;
          std::__cxx11::string::string((string *)&local_1a50,"facet",&local_1a51);
          local_1a53 = 1;
          bVar1 = std::operator==(&local_1a50,normal + 0x7f8);
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_1a7a = 1;
            std::__cxx11::string::string((string *)&local_1a78,"faced",&local_1a79);
            local_1a7b = 1;
            bVar1 = std::operator==(&local_1a78,normal + 0x7f8);
            local_3d3a = true;
            if (!bVar1) goto LAB_0058fc58;
          }
          std::allocator<char>::allocator();
          outer[0x7fe] = '\x01';
          std::__cxx11::string::string((string *)&local_1aa0,"normal",(allocator *)(outer + 0x7ff));
          outer[0x7fd] = '\x01';
          local_3d3a = std::operator!=(&local_1aa0,
                                       (char *)&tri.m_tangents.
                                                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
LAB_0058fc58:
        if ((outer[0x7fd] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_1aa0);
        }
        if ((outer[0x7fe] & 1U) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(outer + 0x7ff));
        }
        if ((local_1a7b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1a78);
        }
        if ((local_1a7a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1a79);
        }
        if ((local_1a53 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_1a50);
        }
        if ((local_1a52 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
        }
        if (local_3d3a == false) {
          local_19e4.x = (float)local_1a08;
          local_19e0 = (float)nd[0];
          n.field_0.x = (float)nd[1];
          Triangle::setNormals
                    ((Triangle *)&n.field_1,(vec3 *)&local_19e4,(vec3 *)&local_19e4,
                     (vec3 *)&local_19e4);
          iVar2 = __isoc99_fscanf(__stream_00,"%s %s",loop + 0x7f8,local_2aa8);
          local_2aca = 0;
          local_2acb = 0;
          index._6_1_ = 0;
          index._5_1_ = 0;
          local_3d9d = true;
          if (iVar2 == 2) {
            std::allocator<char>::allocator();
            local_2aca = 1;
            std::__cxx11::string::string((string *)&local_2ac8,"outer",&local_2ac9);
            local_2acb = 1;
            bVar1 = std::operator!=(&local_2ac8,loop + 0x7f8);
            local_3d9d = true;
            if (!bVar1) {
              std::allocator<char>::allocator();
              index._6_1_ = 1;
              std::__cxx11::string::string
                        ((string *)&local_2af0,"loop",(allocator *)((long)&index + 7));
              index._5_1_ = 1;
              local_3d9d = std::operator!=(&local_2af0,local_2aa8);
            }
          }
          if ((index._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2af0);
          }
          if ((index._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&index + 7));
          }
          if ((local_2acb & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2ac8);
          }
          if ((local_2aca & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_2ac9);
          }
          if (local_3d9d == false) {
            local_2b00 = 0;
            while( true ) {
              local_330c = __isoc99_fscanf(__stream_00,"%s",local_3308);
              local_3dcd = false;
              if (local_330c == 1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_3330,"endloop",&local_3331);
                local_3dcd = std::operator==(&local_3330,local_3308);
                std::__cxx11::string::~string((string *)&local_3330);
                std::allocator<char>::~allocator((allocator<char> *)&local_3331);
              }
              if (local_3dcd != false) {
                Mesh::addTriangle(_mesh,(Triangle *)&n.field_1);
                iVar2 = __isoc99_fscanf(__stream_00,"%s",local_3b98);
                local_3e0d = true;
                if (iVar2 == 1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_3bb8,"endfacet",&local_3bb9);
                  local_3e0d = std::operator!=(&local_3bb8,local_3b98);
                  std::__cxx11::string::~string((string *)&local_3bb8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_3bb9);
                }
                if (local_3e0d == false) {
                  local_1a30 = 0;
                }
                else {
                  poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (5).");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  local_1a30 = 2;
                }
                goto LAB_00590762;
              }
              v.field_1._2_1_ = 0;
              v.field_1._1_1_ = 0;
              local_3ddb = false;
              if (local_330c == 1) {
                std::allocator<char>::allocator();
                v.field_1._2_1_ = 1;
                std::__cxx11::string::string
                          ((string *)&v.field_2,"vertex",(allocator *)((long)&v.field_1 + 3));
                v.field_1._1_1_ = 1;
                local_3ddb = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&v.field_2,local_3308);
              }
              if ((v.field_1._1_1_ & 1) != 0) {
                std::__cxx11::string::~string((string *)&v.field_2);
              }
              if ((v.field_1._2_1_ & 1) != 0) {
                std::allocator<char>::~allocator((allocator<char> *)((long)&v.field_1 + 3));
              }
              if (local_3ddb == false) {
                poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (4).");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                local_1a30 = 2;
                goto LAB_00590762;
              }
              iVar2 = __isoc99_fscanf(__stream_00,"%lg %lg %lg",&stack0xffffffffffffcc78,vd,vd + 1);
              if (iVar2 != 3) break;
              glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                        ((vec<3,float,(glm::qualifier)0> *)(endfacet + 0x7f8),dStack_3388,vd[0],
                         vd[1]);
              Triangle::setVertex((Triangle *)&n.field_1,local_2b00,(vec3 *)(endfacet + 0x7f8));
              local_2b00 = local_2b00 + 1;
            }
            poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (3).");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_1a30 = 2;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (2). ");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_1a30 = 2;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,"facet: ");
          poVar6 = std::operator<<(poVar6,normal + 0x7f8);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<((ostream *)&std::cout,"normal: ");
          poVar6 = std::operator<<(poVar6,(char *)&tri.m_tangents.
                                                                                                      
                                                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<((ostream *)&std::cerr,"IOError: bad format (1).");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_1a30 = 2;
        }
      }
LAB_00590762:
      Triangle::~Triangle((Triangle *)&n.field_1);
    } while (local_1a30 == 0);
  }
  if (local_1a30 != 2) {
    fclose(__stream_00);
    return true;
  }
LAB_00590af9:
  fclose(__stream_00);
  return false;
}

Assistant:

bool loadSTL( const std::string& _filename, Mesh& _mesh ) {
    FILE * stl_file = fopen(_filename.c_str(),"rb");
    if (NULL == stl_file) {
        fprintf(stderr,"IOError: %s could not be opened...\n", _filename.c_str());
        return false;
    }

     // Specifically 80 character header
    char header[80];
    char solid[80] = {0};
    bool is_ascii = true;
    if (fread(header, 1, 80, stl_file) != 80) {
        std::cerr << "IOError: too short (1)." << std::endl;
        goto close_false;
    }
    sscanf(header, "%79s", solid);
  
    if ( std::string("solid") != solid) 
        is_ascii = false;
    else {
        // might still be binary
        char buf[4];
        if ( fread(buf, 1, 4, stl_file) != 4) {
            std::cerr << "IOError: too short (3)." << std::endl;
            goto close_false;
        }
    
        size_t num_faces = *reinterpret_cast<unsigned int*>(buf);
        fseek(stl_file,0,SEEK_END);
        int file_size = ftell(stl_file);
        if (file_size == 80 + 4 + (4*12 + 2) * num_faces) is_ascii = false;
        else is_ascii = true;
    }

    if (is_ascii) {
        // Rewind to end of header
        //stl_file = fopen(filename.c_str(),"r");
        //stl_file = freopen(NULL,"r",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        if (NULL == stl_file) {
            fprintf(stderr,"IOError: stl file could not be reopened as ascii ...\n");
            return false;
        }
        // Read 80 header
        // Eat file name

        char name[LINE_MAX];
        if ( NULL == fgets(name, LINE_MAX, stl_file)) {
            std::cerr << "IOError: ascii too short (2)." << std::endl;
            goto close_false;
        }

        // ascii
        while(true) {
            int ret;
            char facet[LINE_MAX];
            char normal[LINE_MAX];

            Triangle tri;
            glm::vec3 n;

            double nd[3];
            ret = fscanf(stl_file,"%s %s %lg %lg %lg", facet, normal, nd, nd+1, nd+2);
            n.x = nd[0];
            n.y = nd[1];
            n.z = nd[2];

            if (std::string("endsolid") == facet)
                break;
            
            if (ret != 5 || 
                !(  std::string("facet") == facet || 
                    std::string("faced") == facet) ||
                    std::string("normal") != normal) {
                std::cout << "facet: " << facet << std::endl;
                std::cout << "normal: " <<normal << std::endl;
                std::cerr << "IOError: bad format (1)." << std::endl;
                goto close_false;
            }
            // copy casts to Type
            n.x = nd[0]; 
            n.y = nd[1];
            n.z = nd[2];
            tri.setNormals(n, n, n);
            char outer[LINE_MAX], loop[LINE_MAX];
            ret = fscanf(stl_file,"%s %s",outer,loop);
            if (ret != 2 || std::string("outer") != outer || std::string("loop") != loop) {
                std::cerr << "IOError: bad format (2). " << std::endl;
                goto close_false;
            }
            
            size_t index = 0;
            while(true) {
                char word[LINE_MAX];
                int ret = fscanf(stl_file, "%s", word);
                if (ret == 1 && std::string("endloop") == word)
                    break;
                else if (ret == 1 && std::string("vertex") == word) {
                    glm::vec3 v;
                    double vd[3];
                    int ret = fscanf(stl_file, "%lg %lg %lg", vd, vd+1, vd+2);
                    if (ret != 3) {
                        std::cerr << "IOError: bad format (3)." << std::endl;
                        goto close_false;
                    }
                    tri.setVertex(index, glm::vec3(vd[0], vd[1], vd[2]));
                    index++;
                }
                else {
                    std::cerr << "IOError: bad format (4)." << std::endl;
                    goto close_false;
                }
            }
            _mesh.addTriangle(tri);

            char endfacet[LINE_MAX];
            ret = fscanf(stl_file,"%s",endfacet);
            if (ret != 1 || std::string("endfacet") != endfacet) {
                std::cerr << "IOError: bad format (5)." << std::endl;
                goto close_false;
            }
        }
        // read endfacet
        goto close_true;
    }
    else {
        // Binary
        // stl_file = freopen(NULL,"rb",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        // Read 80 header
        char header[80];
        if (fread(header, sizeof(char), 80, stl_file) != 80) {
            std::cerr << "IOError: bad format (6)." << std::endl;
            goto close_false;
        }
        // Read number of triangles
        unsigned int num_tri;
        if (fread(&num_tri, sizeof(unsigned int), 1, stl_file) != 1) {
            std::cerr << "IOError: bad format (7)." << std::endl;
            goto close_false;
        }

        std::vector<Triangle> triangles;
        triangles.resize(num_tri);
        for(int t = 0; t < (int)num_tri; t++) {
            Triangle tri;

            // Read normal
            glm::vec3 n;
            if (fread(&n.x, sizeof(float), 3, stl_file) != 3) {
                std::cerr << "IOError: bad format (8)." << std::endl;
                goto close_false;
            }
            tri.setNormals(n, n, n);

            // Read each vertex
            for (size_t c = 0; c < 3; c++) {
                glm::vec3 v;
                if (fread (&v.x, sizeof(float), 3, stl_file) != 3) {
                    std::cerr << "IOError: bad format (9)." << std::endl;
                    goto close_false;
                }
                tri.setVertex(c, v);
            }
            
            // Read attribute size
            unsigned short att_count;
            if (fread(&att_count, sizeof(unsigned short), 1, stl_file) != 1) {
                std::cerr << "IOError: bad format (10)." << std::endl;
                goto close_false;
            }
        }
        goto close_true;
    }

    close_false:
        fclose(stl_file);
        return false;
    close_true:
        fclose(stl_file);
        return true;
}